

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_ring_multiply(uint16_t *out,uint16_t *a,uint16_t *b,uint p,uint q)

{
  uint16_t uVar1;
  uint64_t qrecip_00;
  void *b_00;
  ulong uVar2;
  uint16_t q_00;
  uint local_4c;
  uint local_48;
  uint i_3;
  uint i_2;
  uint j;
  uint i_1;
  uint i;
  uint32_t *unreduced;
  uint64_t qrecip;
  uint q_local;
  uint p_local;
  uint16_t *b_local;
  uint16_t *a_local;
  uint16_t *out_local;
  
  q_00 = (uint16_t)q;
  qrecip_00 = reciprocal_for_reduction(q_00);
  b_00 = safemalloc((ulong)(p << 1),4,0);
  for (j = 0; j < p << 1; j = j + 1) {
    *(undefined4 *)((long)b_00 + (ulong)j * 4) = 0;
  }
  for (i_2 = 0; i_2 < p; i_2 = i_2 + 1) {
    for (i_3 = 0; i_3 < p; i_3 = i_3 + 1) {
      uVar1 = reduce(*(int *)((long)b_00 + (ulong)(i_2 + i_3) * 4) + (uint)a[i_2] * (uint)b[i_3],
                     q_00,qrecip_00);
      *(uint *)((long)b_00 + (ulong)(i_2 + i_3) * 4) = (uint)uVar1;
    }
  }
  local_48 = p * 2;
  while (local_48 = local_48 - 1, p <= local_48) {
    *(int *)((long)b_00 + (ulong)(local_48 - p) * 4) =
         *(int *)((long)b_00 + (ulong)local_48 * 4) +
         *(int *)((long)b_00 + (ulong)(local_48 - p) * 4);
    uVar2 = (ulong)((local_48 - p) + 1);
    *(int *)((long)b_00 + uVar2 * 4) =
         *(int *)((long)b_00 + (ulong)local_48 * 4) + *(int *)((long)b_00 + uVar2 * 4);
    *(undefined4 *)((long)b_00 + (ulong)local_48 * 4) = 0;
  }
  for (local_4c = 0; local_4c < p; local_4c = local_4c + 1) {
    uVar1 = reduce(*(uint32_t *)((long)b_00 + (ulong)local_4c * 4),q_00,qrecip_00);
    out[local_4c] = uVar1;
  }
  smemclr(b_00,(ulong)(p << 1) << 2);
  safefree(b_00);
  return;
}

Assistant:

void ntru_ring_multiply(uint16_t *out, const uint16_t *a, const uint16_t *b,
                        unsigned p, unsigned q)
{
    SETUP;

    /*
     * Strategy: just compute the full product with 2p coefficients,
     * and then reduce it mod x^p-x-1 by working downwards from the
     * top coefficient replacing x^{p+k} with (x+1)x^k for k = ...,1,0.
     *
     * Possibly some speed could be gained here by doing the recursive
     * Karatsuba optimisation for the initial multiplication? But I
     * haven't tried it.
     */
    uint32_t *unreduced = snewn(2*p, uint32_t);
    for (unsigned i = 0; i < 2*p; i++)
        unreduced[i] = 0;
    for (unsigned i = 0; i < p; i++)
        for (unsigned j = 0; j < p; j++)
            unreduced[i+j] = REDUCE(unreduced[i+j] + a[i] * b[j]);

    for (unsigned i = 2*p - 1; i >= p; i--) {
        unreduced[i-p] += unreduced[i];
        unreduced[i-p+1] += unreduced[i];
        unreduced[i] = 0;
    }

    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(unreduced[i]);

    smemclr(unreduced, 2*p * sizeof(*unreduced));
    sfree(unreduced);
}